

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O2

void __thiscall QFunctionJAOHTree::DeInitialize(QFunctionJAOHTree *this)

{
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::clear(&(this->super_QFunctionJAOH)._m_QValues.super_matrix_t);
  (this->super_QFunctionJAOH).field_0x38 = 0;
  return;
}

Assistant:

void QFunctionJAOHTree::DeInitialize()
{
    _m_QValues.clear();
    _m_initialized=false;
}